

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_start(uv_timer_t *handle,uv_timer_cb cb,uint64_t timeout,uint64_t repeat)

{
  uint64_t uVar1;
  heap *heap;
  ulong local_38;
  uint64_t clamped_timeout;
  uint64_t repeat_local;
  uint64_t timeout_local;
  uv_timer_cb cb_local;
  uv_timer_t *handle_local;
  
  if (((handle->flags & 3) == 0) && (cb != (uv_timer_cb)0x0)) {
    if ((handle->flags & 4) != 0) {
      uv_timer_stop(handle);
    }
    local_38 = handle->loop->time + timeout;
    if (local_38 < timeout) {
      local_38 = 0xffffffffffffffff;
    }
    handle->timer_cb = cb;
    handle->timeout = local_38;
    handle->repeat = repeat;
    uVar1 = handle->loop->timer_counter;
    handle->loop->timer_counter = uVar1 + 1;
    handle->start_id = uVar1;
    heap = timer_heap(handle->loop);
    heap_insert(heap,(heap_node *)handle->heap_node,timer_less_than);
    if (((handle->flags & 4) == 0) && (handle->flags = handle->flags | 4, (handle->flags & 8) != 0))
    {
      handle->loop->active_handles = handle->loop->active_handles + 1;
    }
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_timer_start(uv_timer_t* handle,
                   uv_timer_cb cb,
                   uint64_t timeout,
                   uint64_t repeat) {
  uint64_t clamped_timeout;

  if (uv__is_closing(handle) || cb == NULL)
    return UV_EINVAL;

  if (uv__is_active(handle))
    uv_timer_stop(handle);

  clamped_timeout = handle->loop->time + timeout;
  if (clamped_timeout < timeout)
    clamped_timeout = (uint64_t) -1;

  handle->timer_cb = cb;
  handle->timeout = clamped_timeout;
  handle->repeat = repeat;
  /* start_id is the second index to be compared in uv__timer_cmp() */
  handle->start_id = handle->loop->timer_counter++;

  heap_insert(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_start(handle);

  return 0;
}